

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

Cord * __thiscall absl::lts_20250127::Cord::AssignLargeString(Cord *this,string *src)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  CordRep *rep;
  CordzUpdateScope CVar3;
  Nonnull<CordRep_*> pCVar4;
  long sampling_stride;
  long *in_FS_OFFSET;
  CordzUpdateScope scope;
  CordzUpdateScope local_28;
  
  if (src->_M_string_length < 0x200) {
    __assert_fail("src.size() > kMaxBytesToCopy",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                  ,0x17b,"Cord &absl::Cord::AssignLargeString(std::string &&)");
  }
  pCVar4 = CordRepFromString(src);
  rep = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if (rep == (CordRep *)0x0 || ((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    if (pCVar4 == (Nonnull<CordRep_*>)0x0) {
      __assert_fail("rep",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                    ,0x4e8,
                    "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                   );
    }
    (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar4;
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
    if (in_FS_OFFSET[-0xb] < 2) {
      sampling_stride =
           cord_internal::cordz_should_profile_slow((SamplingState *)(*in_FS_OFFSET + -0x58));
    }
    else {
      in_FS_OFFSET[-0xb] = in_FS_OFFSET[-0xb] + -1;
      sampling_stride = 0;
    }
    if (0 < sampling_stride) {
      cord_internal::CordzInfo::TrackCord((InlineData *)this,kAssignString,sampling_stride);
    }
  }
  else {
    local_28.info_ = cord_internal::InlineData::cordz_info((InlineData *)this);
    if (local_28.info_ != (CordzInfo *)0x0) {
      cord_internal::CordzInfo::Lock(local_28.info_,kAssignString);
    }
    CVar3.info_ = local_28.info_;
    if (pCVar4 == (Nonnull<CordRep_*>)0x0) {
      __assert_fail("rep",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                    ,0x4f6,
                    "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
      __assert_fail("data_.is_tree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                    ,0x4f7,
                    "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar4;
    if (local_28.info_ != (CordzInfo *)0x0) {
      Mutex::AssertHeld(&(local_28.info_)->mutex_);
      (CVar3.info_)->rep_ = pCVar4;
    }
    LOCK();
    pRVar1 = &rep->refcount;
    uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
      __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0xac,
                    "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
    }
    if (uVar2 == 2) {
      cord_internal::CordRep::Destroy(rep);
    }
    cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_28);
  }
  return this;
}

Assistant:

Cord& Cord::AssignLargeString(std::string&& src) {
  auto constexpr method = CordzUpdateTracker::kAssignString;
  assert(src.size() > kMaxBytesToCopy);
  CordRep* rep = CordRepFromString(std::move(src));
  if (CordRep* tree = contents_.tree()) {
    CordzUpdateScope scope(contents_.cordz_info(), method);
    contents_.SetTree(rep, scope);
    CordRep::Unref(tree);
  } else {
    contents_.EmplaceTree(rep, method);
  }
  return *this;
}